

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

ssize_t __thiscall QIODevice::write(QIODevice *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  uint uVar3;
  int iVar4;
  QIODevicePrivate *pQVar5;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  qint64 written;
  bool sequential;
  QIODevicePrivate *d;
  OpenModeFlag in_stack_ffffffffffffff8c;
  QIODevicePrivate *in_stack_ffffffffffffff90;
  QRingBufferRef *local_18;
  CompareAgainstLiteralZero local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QIODevice *)0x12b514);
  QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff8c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_9,0);
  bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  if (bVar1) {
    bVar1 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)this >> 0x20,0),(OpenModeFlag)in_stack_ffffffffffffff90);
    if (bVar1) {
      checkWarnMessage(this,"write","device not open");
      local_18 = (QRingBufferRef *)0xffffffffffffffff;
    }
    else {
      checkWarnMessage(this,"write","ReadOnly device");
      local_18 = (QRingBufferRef *)0xffffffffffffffff;
    }
  }
  else if ((long)__buf < 0) {
    checkWarnMessage(this,"write","Called with maxSize < 0");
    local_18 = (QRingBufferRef *)0xffffffffffffffff;
  }
  else {
    bVar1 = QIODevicePrivate::isSequential(in_stack_ffffffffffffff90);
    if (((pQVar5->pos == pQVar5->devicePos) || (bVar1)) ||
       (uVar3 = (*this->_vptr_QIODevice[7])(this,pQVar5->pos), (uVar3 & 1) != 0)) {
      iVar4 = (*this->_vptr_QIODevice[0x12])(this,CONCAT44(in_register_00000034,__fd),__buf);
      local_18 = (QRingBufferRef *)CONCAT44(extraout_var,iVar4);
      if ((!bVar1) && (0 < (long)local_18)) {
        pQVar5->pos = (long)&local_18->m_buf + pQVar5->pos;
        pQVar5->devicePos = (long)&local_18->m_buf + pQVar5->devicePos;
        QIODevicePrivate::QRingBufferRef::skip(local_18,(qint64)this);
      }
    }
    else {
      local_18 = (QRingBufferRef *)0xffffffffffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ssize_t)local_18;
}

Assistant:

qint64 QIODevice::write(const char *data, qint64 maxSize)
{
    Q_D(QIODevice);
    CHECK_WRITABLE(write, qint64(-1));
    CHECK_MAXLEN(write, qint64(-1));

    const bool sequential = d->isSequential();
    // Make sure the device is positioned correctly.
    if (d->pos != d->devicePos && !sequential && !seek(d->pos))
        return qint64(-1);

#ifdef Q_OS_WIN
    if (d->openMode & Text) {
        const char *endOfData = data + maxSize;
        const char *startOfBlock = data;

        qint64 writtenSoFar = 0;
        const qint64 savedPos = d->pos;

        forever {
            const char *endOfBlock = startOfBlock;
            while (endOfBlock < endOfData && *endOfBlock != '\n')
                ++endOfBlock;

            qint64 blockSize = endOfBlock - startOfBlock;
            if (blockSize > 0) {
                qint64 ret = writeData(startOfBlock, blockSize);
                if (ret <= 0) {
                    if (writtenSoFar && !sequential)
                        d->buffer.skip(d->pos - savedPos);
                    return writtenSoFar ? writtenSoFar : ret;
                }
                if (!sequential) {
                    d->pos += ret;
                    d->devicePos += ret;
                }
                writtenSoFar += ret;
            }

            if (endOfBlock == endOfData)
                break;

            qint64 ret = writeData("\r\n", 2);
            if (ret <= 0) {
                if (writtenSoFar && !sequential)
                    d->buffer.skip(d->pos - savedPos);
                return writtenSoFar ? writtenSoFar : ret;
            }
            if (!sequential) {
                d->pos += ret;
                d->devicePos += ret;
            }
            ++writtenSoFar;

            startOfBlock = endOfBlock + 1;
        }

        if (writtenSoFar && !sequential)
            d->buffer.skip(d->pos - savedPos);
        return writtenSoFar;
    }
#endif

    qint64 written = writeData(data, maxSize);
    if (!sequential && written > 0) {
        d->pos += written;
        d->devicePos += written;
        d->buffer.skip(written);
    }
    return written;
}